

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void sti_(PDISASM pMyDisasm)

{
  PDISASM pMyDisasm_local;
  
  (pMyDisasm->Instruction).Category = 0x1000a;
  strcpy((pMyDisasm->Instruction).Mnemonic,"sti");
  (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
  (pMyDisasm->Operand1).OpType = 0x20000;
  (pMyDisasm->Operand1).Registers.type = 0x20;
  (pMyDisasm->Operand1).Registers.special = 1;
  (pMyDisasm->Operand1).OpSize = 1;
  FillFlags(pMyDisasm,100);
  return;
}

Assistant:

void __bea_callspec__ sti_(PDISASM pMyDisasm)
{
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+FLAG_CONTROL_INSTRUCTION;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "sti");
    #endif
    GV.EIP_++;
    pMyDisasm->Operand1.OpType = REGISTER_TYPE;
    pMyDisasm->Operand1.Registers.type = SPECIAL_REG;
    pMyDisasm->Operand1.Registers.special = REG0;
    pMyDisasm->Operand1.OpSize = 1;
    FillFlags(pMyDisasm, 100);
}